

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void capnp::_::anon_unknown_0::doForwardingTest(bool allowForwarding,bool addReflectionLeg)

{
  Disposer DVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  ArrayPtr<kj::String> argValues;
  ArrayPtr<kj::String> argValues_00;
  RequestHook *pRVar6;
  long *plVar7;
  size_t sVar8;
  undefined1 node [8];
  TestMoreStuffImpl *pTVar9;
  ClientHook *pCVar10;
  Vat *pVVar11;
  WeakFulfiller<capnp::Capability::Client> *params;
  TestVat *network;
  Vat *pVVar12;
  Entry *pEVar13;
  undefined8 *puVar14;
  undefined4 uVar15;
  StringPtr *pSVar16;
  StringPtr *pSVar17;
  void *__buf;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  nfds_t extraout_RDX_02;
  nfds_t extraout_RDX_03;
  nfds_t extraout_RDX_04;
  nfds_t __nfds;
  void *__buf_00;
  char (*params_00) [79];
  char (*params_01) [80];
  long lVar18;
  undefined7 in_register_00000039;
  undefined1 unique;
  char *pcVar19;
  DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *in_R9;
  PromiseFulfiller<capnp::Capability::Client> *ptrCopy;
  PromiseNode *ptrCopy_1;
  bool bVar20;
  undefined4 uVar21;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar22;
  Own<capnp::ClientHook,_std::nullptr_t> OVar23;
  StringPtr to;
  StringPtr to_00;
  StringPtr to_01;
  StringPtr to_02;
  StringPtr name;
  StringPtr name_00;
  StringPtr key;
  StringPtr name_01;
  void *continuationTracePtr;
  DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> _kjCondition;
  Client bobCap;
  Client daveCap;
  int eveHandleCount;
  int eveCallCount;
  int carolHandleCount;
  int carolCallCount;
  TestContext context;
  char *pcVar24;
  undefined *puVar25;
  undefined1 local_3c8 [12];
  undefined4 uStack_3bc;
  char *local_3b8 [2];
  undefined8 uStack_3a8;
  WirePointer *pWStack_3a0;
  RequestHook *local_398;
  long *local_390;
  undefined1 local_388 [16];
  StringPtr local_378;
  StringPtr *local_368;
  bool local_360;
  undefined7 uStack_35f;
  RequestHook *local_358;
  undefined1 local_350 [8];
  long *local_348 [2];
  undefined1 local_338 [8];
  TestMoreStuffImpl *local_330;
  long *local_328;
  Own<capnp::ClientHook,_std::nullptr_t> local_320;
  Vat *local_310;
  Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> local_308;
  undefined4 local_2f4;
  int local_2f0 [2];
  undefined1 local_2e8 [32];
  StringPtr *pSStack_2c8;
  Disposer *local_2c0;
  Vat *local_2b0;
  Vat *local_2a8;
  int local_2a0 [2];
  char *local_298;
  undefined *puStack_290;
  undefined8 local_288;
  char *local_280;
  undefined *puStack_278;
  undefined8 local_270;
  StringPtr local_268;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> local_258 [6];
  undefined8 *local_228;
  long *local_220;
  Maybe<capnp::MessageSize> local_218;
  Maybe<capnp::MessageSize> local_200;
  TestContext local_1e8;
  
  TestContext::TestContext(&local_1e8);
  pVVar12 = local_1e8.alice;
  local_310 = local_1e8.bob;
  local_2a0[1] = 0;
  local_2a0[0] = 0;
  local_1e8.network.forwardingEnabled = allowForwarding;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)&local_308,local_2a0 + 1,local_2a0);
  name.content.size_ = 6;
  name.content.ptr = "carol";
  local_2a8 = (anonymous_namespace)::TestContext::
              initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
                        ((TestContext *)&local_1e8,name,&local_308);
  pTVar9 = local_308.ptr;
  if (local_308.ptr != (TestMoreStuffImpl *)0x0) {
    local_308.ptr = (TestMoreStuffImpl *)0x0;
    (**(local_308.disposer)->_vptr_Disposer)
              (local_308.disposer,
               &(pTVar9->super_Server).field_0x0 + *(long *)(*(long *)&pTVar9->super_Server + -0x10)
              );
  }
  local_2b0 = pVVar12;
  local_2f4 = (undefined4)CONCAT71(in_register_00000039,allowForwarding);
  local_2f0[1] = 0;
  local_2f0[0] = 0;
  params = (WeakFulfiller<capnp::Capability::Client> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<capnp::Capability::Client>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_006bc3c0;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006bc3f8;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<capnp::Capability::Client,kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<capnp::Capability::Client>&>
            ((PromiseDisposer *)local_3c8,params);
  local_2e8._0_8_ = (SegmentBuilder *)0x0;
  name_00.content.size_ = 5;
  name_00.content.ptr = "dave";
  local_2e8._8_8_ = &params->super_WeakFulfillerBase;
  local_2e8._16_8_ = params;
  network = TestNetwork::add(&local_1e8.network,name_00);
  pVVar12 = (Vat *)operator_new(0x18);
  local_350 = (undefined1  [8])local_3c8._0_8_;
  pVVar12->vatNetwork = network;
  local_3c8._0_8_ =
       kj::_::
       SimpleTransformPromiseNode<capnp::Capability::Client,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1128:47)>
       ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Capability::Client,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_>,kj::_::PromiseDisposer,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_,void*&>
            ((PromiseDisposer *)local_388,(OwnPromiseNode *)local_350,
             (anon_class_1_0_00000001_for_func *)local_338,(void **)local_3c8);
  newLocalPromiseClient
            ((capnp *)local_3c8,(Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)local_388);
  uVar3 = local_388._0_8_;
  if ((SegmentBuilder *)local_388._0_8_ != (SegmentBuilder *)0x0) {
    local_388._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  RVar22 = makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
                     ((capnp *)&pVVar12->rpcSystem,&network->super_TestVatBase,(Client *)local_3c8);
  uVar3 = stack0xfffffffffffffc40;
  if ((Vat *)stack0xfffffffffffffc40 != (Vat *)0x0) {
    stack0xfffffffffffffc40 = (Vat *)0x0;
    (*(code *)((SegmentReader *)local_3c8._0_8_)->arena->_vptr_Arena)
              (local_3c8._0_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10),
               RVar22.super_RpcSystemBase.impl.ptr);
  }
  node = local_350;
  local_3c8._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance;
  unique0x1000164d = pVVar12;
  if (local_350 != (undefined1  [8])0x0) {
    local_350 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  key.content.size_ = 5;
  key.content.ptr = "dave";
  pEVar13 = kj::
            HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
            ::insert(&local_1e8.vats,key,
                     (Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> *)
                     local_3c8);
  pVVar12 = (pEVar13->value).ptr;
  if ((Vat *)stack0xfffffffffffffc40 != (Vat *)0x0) {
    (*(code *)((SegmentReader *)local_3c8._0_8_)->arena->_vptr_Arena)();
  }
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  if (addReflectionLeg) {
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)local_338,local_2f0 + 1,local_2f0);
    name_01.content.size_ = 4;
    name_01.content.ptr = "eve";
    (anonymous_namespace)::TestContext::
    initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
              ((TestContext *)&local_1e8,name_01,
               (Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)local_338);
    pTVar9 = local_330;
    if (local_330 != (TestMoreStuffImpl *)0x0) {
      local_330 = (TestMoreStuffImpl *)0x0;
      (***(_func_int ***)local_338)
                (local_338,
                 &(pTVar9->super_Server).field_0x0 +
                 *(long *)(*(long *)&pTVar9->super_Server + -0x10));
    }
    to.content.size_ = 4;
    to.content.ptr = "eve";
    TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
              ((Client *)local_3c8,pVVar12,to,false);
    sVar8 = local_378.content.size_;
    if (local_388[0] == (PromiseDisposer)0x1) {
      local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
      if ((long *)local_378.content.size_ != (long *)0x0) {
        local_378.content.size_ = 0;
        (*(code *)**(undefined8 **)local_378.content.ptr)
                  (local_378.content.ptr,sVar8 + *(long *)(*(long *)sVar8 + -0x10));
      }
    }
    DVar1._vptr_Disposer = *(_func_int ***)(local_3c8._0_8_ + -0x18);
    local_378.content.ptr =
         (char *)CONCAT44(*(undefined4 *)(local_3c8 + 4 + (long)DVar1._vptr_Disposer),
                          *(undefined4 *)(local_3c8 + (long)DVar1._vptr_Disposer));
    local_378.content.size_ =
         CONCAT44(*(undefined4 *)((long)&uStack_3bc + (long)DVar1._vptr_Disposer),
                  *(undefined4 *)(local_3c8 + 8 + (long)DVar1._vptr_Disposer));
    *(undefined8 *)(local_3c8 + 8 + (long)DVar1._vptr_Disposer) = 0;
    pcVar19 = local_3b8[0];
    local_388._8_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
    local_388[0] = (PromiseDisposer)0x1;
    if ((long *)local_3b8[0] != (long *)0x0) {
      local_3b8[0] = (char *)0x0;
      (*(code *)**(undefined8 **)stack0xfffffffffffffc40)
                (stack0xfffffffffffffc40,(long)pcVar19 + *(long *)(*(long *)pcVar19 + -0x10));
    }
  }
  unique = 0;
  to_00.content.size_ = 6;
  to_00.content.ptr = "carol";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_350,pVVar12,to_00,false);
  puVar14 = (undefined8 *)operator_new(0x50);
  pPVar2 = ((PromiseArenaMember *)((long)local_350 + -0x20))->arena;
  uVar3 = *(undefined8 *)(local_350 + (long)pPVar2);
  uVar4 = *(undefined8 *)((long)local_348 + (long)pPVar2);
  *(undefined8 *)((long)local_348 + (long)pPVar2) = 0;
  kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
            ((Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)local_3c8,
             (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)local_388);
  puVar14[9] = 0;
  puVar14[8] = 0x6bb2b0;
  *puVar14 = 0x6bb1f0;
  puVar14[2] = uVar3;
  puVar14[3] = uVar4;
  puVar14[1] = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
            ((Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)(puVar14 + 4),
             (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)local_3c8);
  pcVar19 = local_3b8[1];
  if ((local_3c8[0] == (PromiseDisposer)0x1) && ((long *)local_3b8[1] != (long *)0x0)) {
    local_3b8[1] = (char *)0x0;
    (*(code *)**(undefined8 **)local_3b8[0])
              (local_3b8[0],(undefined1 *)((long)pcVar19 + *(long *)(*(long *)pcVar19 + -0x10)));
  }
  register0x00000028 = puVar14 + 8;
  local_3c8._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder>::instance;
  OVar23 = Capability::Client::makeLocalClient
                     ((Client *)&local_320,
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_3c8);
  uVar3 = stack0xfffffffffffffc40;
  if ((Vat *)stack0xfffffffffffffc40 != (Vat *)0x0) {
    stack0xfffffffffffffc40 = (Vat *)0x0;
    (*(code *)**(undefined8 **)local_3c8._0_8_)
              (local_3c8._0_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10),OVar23.ptr);
  }
  (*(params->super_PromiseFulfiller<capnp::Capability::Client>).super_PromiseRejector.
    _vptr_PromiseRejector[2])(params,&local_320);
  pCVar10 = local_320.ptr;
  if (local_320.ptr != (ClientHook *)0x0) {
    local_320.ptr = (ClientHook *)0x0;
    (**(local_320.disposer)->_vptr_Disposer)
              (local_320.disposer,
               (_func_int *)((long)&pCVar10->_vptr_ClientHook + (long)pCVar10->_vptr_ClientHook[-2])
              );
  }
  plVar7 = local_348[1];
  if (local_348[1] != (long *)0x0) {
    local_348[1] = (long *)0x0;
    (**(code **)*local_348[0])(local_348[0],(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  sVar8 = local_378.content.size_;
  if ((local_388[0] == (PromiseDisposer)0x1) && ((long *)local_378.content.size_ != (long *)0x0)) {
    local_378.content.size_ = 0;
    (*(code *)**(undefined8 **)local_378.content.ptr)
              (local_378.content.ptr,sVar8 + *(long *)(*(long *)sVar8 + -0x10));
  }
  (**(params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer)
            (&params->super_WeakFulfillerBase,
             (params->super_PromiseFulfiller<capnp::Capability::Client>).super_PromiseRejector.
             _vptr_PromiseRejector[-2] +
             (long)&(params->super_PromiseFulfiller<capnp::Capability::Client>).
                    super_PromiseRejector._vptr_PromiseRejector);
  to_01.content.size_ = 4;
  to_01.content.ptr = "bob";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_350,local_1e8.alice,to_01,(bool)unique);
  pcVar19 = (char *)0x0;
  to_02.content.size_ = 5;
  to_02.content.ptr = "dave";
  pSVar16 = (StringPtr *)&DAT_00000005;
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_338,local_1e8.alice,to_02,false);
  pVVar11 = local_2a8;
  local_200.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)local_3c8,(Client *)local_338,&local_200);
  local_388._0_8_ = local_3c8._0_8_;
  local_388._8_8_ = stack0xfffffffffffffc40;
  local_378.content.ptr = local_3b8[1];
  PointerBuilder::setCapability
            ((PointerBuilder *)local_388,
             (Own<capnp::ClientHook,_std::nullptr_t> *)
             (((PromiseArenaMember *)((long)local_350 + -0x20))->arena->bytes +
             (long)&((Client *)local_350)->_vptr_Client));
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)local_388,(int)local_3c8,__buf,(size_t)pSVar16,(int)pcVar19);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puStack_278 = &DAT_00506f10;
  local_270 = 0x500000895;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            (local_258,local_388);
  plVar7 = local_220;
  __nfds = extraout_RDX;
  if (local_220 != (long *)0x0) {
    local_220 = (long *)0x0;
    (**(code **)*local_228)(local_228,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    __nfds = extraout_RDX_00;
  }
  pSVar17 = local_368;
  sVar8 = local_378.content.size_;
  if ((long *)local_378.content.size_ != (long *)0x0) {
    local_378.content.size_ = 0;
    local_368 = (StringPtr *)0x0;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
    pcVar19 = (char *)pSVar17;
    (*(code *)**(undefined8 **)CONCAT71(uStack_35f,local_360))
              ((undefined8 *)CONCAT71(uStack_35f,local_360),sVar8,8);
    pSVar16 = pSVar17;
    __nfds = extraout_RDX_01;
  }
  pcVar24 = local_378.content.ptr;
  if ((long *)local_378.content.ptr != (long *)0x0) {
    local_378.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_388._8_8_)
              (local_388._8_8_,(undefined1 *)((long)pcVar24 + *(long *)(*(long *)pcVar24 + -0x10)));
    __nfds = extraout_RDX_02;
  }
  uVar3 = local_388._0_8_;
  if ((SegmentBuilder *)local_388._0_8_ != (SegmentBuilder *)0x0) {
    local_388._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    __nfds = extraout_RDX_03;
  }
  pRVar6 = local_398;
  if (local_398 != (RequestHook *)0x0) {
    local_398 = (RequestHook *)0x0;
    (**(_func_int **)*pWStack_3a0)
              (pWStack_3a0,
               (_func_int *)((long)&pRVar6->_vptr_RequestHook + (long)pRVar6->_vptr_RequestHook[-2])
              );
    __nfds = extraout_RDX_04;
  }
  kj::WaitScope::poll(&local_1e8.waitScope,(pollfd *)0xffffffff,__nfds,(int)pSVar16);
  local_218.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
              *)local_388,(Client *)local_338,&local_218);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)local_2e8,(int)local_388,__buf_00,(size_t)pSVar16,(int)pcVar19);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puStack_290 = &DAT_00506f10;
  local_288 = 0x110000089e;
  pcVar24 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puVar25 = &DAT_00506f10;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)local_3c8,local_2e8);
  pSVar16 = pSStack_2c8;
  uVar3 = local_2e8._24_8_;
  if ((WirePointer *)local_2e8._24_8_ != (WirePointer *)0x0) {
    local_2e8._24_8_ = (WirePointer *)0x0;
    pSStack_2c8 = (StringPtr *)0x0;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
    (**local_2c0->_vptr_Disposer)(local_2c0,uVar3,8);
    pcVar19 = (char *)pSVar16;
  }
  uVar3 = local_2e8._16_8_;
  if ((WeakFulfiller<capnp::Capability::Client> *)local_2e8._16_8_ !=
      (WeakFulfiller<capnp::Capability::Client> *)0x0) {
    local_2e8._16_8_ = (WeakFulfiller<capnp::Capability::Client> *)0x0;
    (**((Disposer *)local_2e8._8_8_)->_vptr_Disposer)
              (local_2e8._8_8_,
               (((PromiseFulfiller<capnp::Capability::Client> *)uVar3)->super_PromiseRejector).
               _vptr_PromiseRejector[-2] +
               (long)&(((PromiseFulfiller<capnp::Capability::Client> *)uVar3)->super_PromiseRejector
                      )._vptr_PromiseRejector);
  }
  uVar3 = local_2e8._0_8_;
  if ((SegmentBuilder *)local_2e8._0_8_ != (SegmentBuilder *)0x0) {
    local_2e8._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  if (local_358 != (RequestHook *)0x0) {
    local_358 = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(uStack_35f,local_360))();
  }
  bVar20 = uStack_3a8._4_2_ == 0;
  local_2e8._16_8_ = local_3b8[1];
  if (bVar20) {
    local_2e8._16_8_ = (WirePointer *)0x0;
  }
  uVar15 = 0x7fffffff;
  if (!bVar20) {
    uVar15 = pWStack_3a0._0_4_;
  }
  uVar21._0_1_ = false;
  uVar21._1_3_ = 0;
  local_2e8._4_4_ = 0;
  local_2e8._8_4_ = 0;
  local_2e8._12_4_ = 0;
  if (!bVar20) {
    uVar21 = local_3c8._0_4_;
    local_2e8._4_4_ = local_3c8._4_4_;
    local_2e8._8_4_ = local_3c8._8_4_;
    local_2e8._12_4_ = uStack_3bc;
  }
  local_2e8[0] = SUB41(uVar21,0);
  local_2e8._1_3_ = SUB43(uVar21,1);
  local_2e8._24_4_ = uVar15;
  local_320 = (Own<capnp::ClientHook,_std::nullptr_t>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)local_2e8,(void *)0x0,0);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)local_388,
             (DebugExpression<capnp::Text::Reader> *)&local_320,(char (*) [4])0x510c11);
  if ((local_360 == false) && (kj::_::Debug::minSeverity < 3)) {
    pcVar19 = "failed: expected resp.getS() == \"bar\"";
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)local_388;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<capnp::Text::Reader,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x89f,ERROR,"\"failed: expected \" \"resp.getS() == \\\"bar\\\"\", _kjCondition",
               (char (*) [38])"failed: expected resp.getS() == \"bar\"",in_R9);
  }
  plVar7 = local_390;
  if (local_390 != (long *)0x0) {
    local_390 = (long *)0x0;
    (**local_398->_vptr_RequestHook)(local_398,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  kj::
  HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
  ::find<capnp::_::(anonymous_namespace)::TestVat*>
            ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              *)local_3c8,(TestVat **)&pVVar12->vatNetwork->connections);
  if ((SegmentBuilder *)local_3c8._0_8_ == (SegmentBuilder *)0x0) {
    local_388._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_388._0_8_ = ((SegmentReader *)local_3c8._0_8_)->arena;
  }
  local_388._8_8_ = &kj::none;
  local_378.content.ptr = " != ";
  local_378.content.size_ = 5;
  local_368 = (StringPtr *)
              CONCAT71(local_368._1_7_,(SegmentBuilder *)local_388._0_8_ != (SegmentBuilder *)0x0);
  if (((SegmentBuilder *)local_388._0_8_ == (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::str<char_const(&)[79]>
              ((String *)local_3c8,
               (kj *)
               "failed: expected dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none",
               params_00);
    local_320.ptr = (ClientHook *)0x12;
    local_320.disposer = (Disposer *)"(can\'t stringify)";
    local_268.content.ptr = "(can\'t stringify)";
    local_268.content.size_ = 0x12;
    kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
              ((String *)local_2e8,(_ *)&local_320,&local_378,&local_268,(StringPtr *)pcVar19);
    pcVar19 = local_3c8;
    local_3b8[1] = (char *)local_2e8._0_8_;
    uStack_3a8 = (CapTableReader *)local_2e8._8_8_;
    pWStack_3a0 = (WirePointer *)local_2e8._16_8_;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x2;
    argValues.size_ = (size_t)puVar25;
    argValues.ptr = (String *)pcVar24;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,(char *)0x8a3,2,0x506f21,pcVar19,argValues);
    lVar18 = 0x18;
    do {
      lVar5 = *(long *)(local_3c8 + lVar18);
      if (lVar5 != 0) {
        pcVar19 = *(char **)(local_3c8 + lVar18 + 8);
        *(undefined8 *)(local_3c8 + lVar18) = 0;
        *(undefined8 *)(local_3c8 + lVar18 + 8) = 0;
        in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
        (**(code **)**(undefined8 **)((long)local_3b8 + lVar18))
                  (*(undefined8 **)((long)local_3b8 + lVar18),lVar5,1);
      }
      lVar18 = lVar18 + -0x18;
    } while (lVar18 != -0x18);
  }
  kj::
  HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
  ::find<capnp::_::(anonymous_namespace)::TestVat*>
            ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              *)local_388,(TestVat **)&pVVar11->vatNetwork->connections);
  if ((SegmentBuilder *)local_388._0_8_ == (SegmentBuilder *)0x0) {
    local_3c8._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_3c8._0_8_ = ((SegmentReader *)local_388._0_8_)->arena;
  }
  stack0xfffffffffffffc40 = &kj::none;
  local_3b8[0] = " != ";
  local_3b8[1] = &DAT_00000005;
  uStack_3a8 = (CapTableReader *)
               CONCAT71(uStack_3a8._1_7_,(SegmentBuilder *)local_3c8._0_8_ != (SegmentBuilder *)0x0)
  ;
  if (((SegmentBuilder *)local_3c8._0_8_ == (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
              ((char *)0x8a4,0x506fd2,0x507033,local_3c8,(char (*) [78])pcVar19,
               (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                *)in_R9);
  }
  kj::
  HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
  ::find<capnp::_::(anonymous_namespace)::TestVat*>
            ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              *)local_3c8,(TestVat **)&pVVar11->vatNetwork->connections);
  if ((SegmentBuilder *)local_3c8._0_8_ == (SegmentBuilder *)0x0) {
    local_388._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_388._0_8_ = ((SegmentReader *)local_3c8._0_8_)->arena;
  }
  local_388._8_8_ = &kj::none;
  local_378.content.ptr = " == ";
  local_378.content.size_ = 5;
  local_368 = (StringPtr *)
              CONCAT71(local_368._1_7_,(SegmentBuilder *)local_388._0_8_ == (SegmentBuilder *)0x0);
  if (((SegmentBuilder *)local_388._0_8_ != (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::str<char_const(&)[80]>
              ((String *)local_3c8,
               (kj *)
               "failed: expected carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none",
               params_01);
    local_320.ptr = (ClientHook *)0x12;
    local_320.disposer = (Disposer *)"(can\'t stringify)";
    local_268.content.ptr = "(can\'t stringify)";
    local_268.content.size_ = 0x12;
    kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
              ((String *)local_2e8,(_ *)&local_320,&local_378,&local_268,(StringPtr *)pcVar19);
    pcVar19 = local_3c8;
    local_3b8[1] = (char *)local_2e8._0_8_;
    uStack_3a8 = (CapTableReader *)local_2e8._8_8_;
    pWStack_3a0 = (WirePointer *)local_2e8._16_8_;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x2;
    argValues_00.size_ = (size_t)puVar25;
    argValues_00.ptr = (String *)pcVar24;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,(char *)0x8a7,2,0x507081,pcVar19,argValues_00);
    lVar18 = 0x18;
    do {
      lVar5 = *(long *)(local_3c8 + lVar18);
      if (lVar5 != 0) {
        pcVar19 = *(char **)(local_3c8 + lVar18 + 8);
        *(undefined8 *)(local_3c8 + lVar18) = 0;
        *(undefined8 *)(local_3c8 + lVar18 + 8) = 0;
        in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
        (**(code **)**(undefined8 **)((long)local_3b8 + lVar18))
                  (*(undefined8 **)((long)local_3b8 + lVar18),lVar5,1);
      }
      lVar18 = lVar18 + -0x18;
    } while (lVar18 != -0x18);
  }
  if ((char)local_2f4 == '\0') {
    kj::
    HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
    ::find<capnp::_::(anonymous_namespace)::TestVat*>
              ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                *)local_388,(TestVat **)&pVVar12->vatNetwork->connections);
    if ((SegmentBuilder *)local_388._0_8_ == (SegmentBuilder *)0x0) {
      local_3c8._0_8_ = (SegmentBuilder *)0x0;
    }
    else {
      local_3c8._0_8_ = ((SegmentReader *)local_388._0_8_)->arena;
    }
    stack0xfffffffffffffc40 = &kj::none;
    local_3b8[0] = " != ";
    local_3b8[1] = (char *)0x5;
    if (kj::_::Debug::minSeverity < 3 && (PromiseNode *)local_3c8._0_8_ == (PromiseNode *)0x0) {
      uStack_3a8._0_1_ = (PromiseNode *)local_3c8._0_8_ != (PromiseNode *)0x0;
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ((char *)0x8b2,0x5071e1,0x507241,local_3c8,(char (*) [77])pcVar19,
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)in_R9);
    }
    local_3c8._0_8_ = &local_1e8.network.forwardCount;
    uStack_3a8._0_1_ = local_1e8.network.forwardCount == 0;
    stack0xfffffffffffffc40 = stack0xfffffffffffffc40 & 0xffffffff00000000;
    local_3b8[0] = " == ";
    local_3b8[1] = (char *)0x5;
    if (kj::_::Debug::minSeverity < 3 && !uStack_3a8._0_1_) {
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8b5,ERROR,
                 "\"failed: expected \" \"context.network.forwardCount == 0\", _kjCondition",
                 (char (*) [51])"failed: expected context.network.forwardCount == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_3c8);
    }
    local_3c8._0_8_ = &local_1e8.network.deniedForwardCount;
    local_3c8._8_4_ = 1;
    local_3b8[0] = " == ";
    local_3b8[1] = (char *)0x5;
    uStack_3a8._0_1_ = local_1e8.network.deniedForwardCount == 1;
    if ((local_1e8.network.deniedForwardCount != 1) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8b6,ERROR,
                 "\"failed: expected \" \"context.network.deniedForwardCount == 1\", _kjCondition",
                 (char (*) [57])"failed: expected context.network.deniedForwardCount == 1",
                 (DebugComparison<unsigned_int_&,_int> *)local_3c8);
    }
  }
  else {
    kj::
    HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
    ::find<capnp::_::(anonymous_namespace)::TestVat*>
              ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                *)local_388,(TestVat **)&pVVar12->vatNetwork->connections);
    if ((SegmentBuilder *)local_388._0_8_ == (SegmentBuilder *)0x0) {
      local_3c8._0_8_ = (SegmentBuilder *)0x0;
    }
    else {
      local_3c8._0_8_ = ((SegmentReader *)local_388._0_8_)->arena;
    }
    stack0xfffffffffffffc40 = &kj::none;
    local_3b8[0] = " == ";
    local_3b8[1] = (char *)0x5;
    if (kj::_::Debug::minSeverity < 3 && (PromiseNode *)local_3c8._0_8_ != (PromiseNode *)0x0) {
      uStack_3a8._0_1_ = (PromiseNode *)local_3c8._0_8_ == (PromiseNode *)0x0;
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ((char *)0x8ab,0x507134,0x507194,local_3c8,(char (*) [77])pcVar19,
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)in_R9);
    }
    local_3c8._0_8_ = &local_1e8.network.deniedForwardCount;
    stack0xfffffffffffffc40 = stack0xfffffffffffffc40 & 0xffffffff00000000;
    local_3b8[0] = " == ";
    local_3b8[1] = (char *)0x5;
    uStack_3a8._0_1_ = local_1e8.network.deniedForwardCount == 0;
    if ((local_1e8.network.deniedForwardCount != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8af,ERROR,
                 "\"failed: expected \" \"context.network.deniedForwardCount == 0\", _kjCondition",
                 (char (*) [57])"failed: expected context.network.deniedForwardCount == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_3c8);
    }
  }
  plVar7 = local_328;
  if (local_328 != (long *)0x0) {
    local_328 = (long *)0x0;
    (*(code *)**(undefined8 **)&local_330->super_Server)
              (local_330,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  plVar7 = local_348[1];
  if (local_348[1] != (long *)0x0) {
    local_348[1] = (long *)0x0;
    (**(code **)*local_348[0])(local_348[0],(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  TestContext::~TestContext(&local_1e8);
  return;
}

Assistant:

void doForwardingTest(bool allowForwarding, bool addReflectionLeg) {
  TestContext context;
  context.network.forwardingEnabled = allowForwarding;

  // Set up Alice, Bob, Carol, and Dave.
  auto& alice = context.alice;
  auto& bob = context.bob;

  int carolCallCount = 0;
  int carolHandleCount = 0;
  auto& carol = context.initVat("carol",
      kj::heap<TestMoreStuffImpl>(carolCallCount, carolHandleCount));

  int eveCallCount = 0;
  int eveHandleCount = 0;

  // Arrange for Dave to forward all calls to Carol.
  auto& dave = [&]() -> TestContext::Vat& {
    auto paf = kj::newPromiseAndFulfiller<Capability::Client>();
    auto& dave = context.initVat("dave", kj::mv(paf.promise));

    kj::Maybe<test::TestMoreStuff::Client> holdBouncer = kj::none;
    if (addReflectionLeg) {
      // Add a `holdBouncer`, so the capability gets bounced from Dave to Eve and back to Dave
      // again before forwarding on to Carol.
      context.initVat("eve", kj::heap<TestMoreStuffImpl>(eveCallCount, eveHandleCount));
      holdBouncer = dave.connect<test::TestMoreStuff>("eve");
    }

    paf.fulfiller->fulfill(kj::heap<TestNoTailForwarder>(
        dave.connect<test::TestMoreStuff>("carol"), kj::mv(holdBouncer)));
    return dave;
  }();

  // Alice connects to Bob and Dave.
  auto bobCap = context.alice.connect<test::TestInterface>("bob");
  auto daveCap = context.alice.connect<test::TestMoreStuff>("dave");

  // Send `bobCap` to Dave, who sends it on to Carol.
  {
    auto req = daveCap.holdRequest();
    req.setCap(kj::mv(bobCap));
    req.send().wait(context.waitScope);
  }

  // Pump event loop to allow things to settle.
  context.waitScope.poll();

  // Tell Dave to invoke the held capability. Dave forwards to Carol. This forces Carol to connect
  // to Bob.
  {
    auto resp = daveCap.callHeldRequest().send().wait(context.waitScope);
    KJ_EXPECT(resp.getS() == "bar");
  }

  // Dave is connected to Carol, who is connected to Bob.
  KJ_EXPECT(dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none);
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

  // Carol never connected to Alice.
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none);

  if (allowForwarding) {
    // Dave never connected to Bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) == kj::none);

    // Forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == addReflectionLeg ? 3 : 1);
    KJ_EXPECT(context.network.deniedForwardCount == 0);
  } else {
    // Dave had to accept the capability from Bob before forwarding it, so had to connect to bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

    // No forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == 0);
    KJ_EXPECT(context.network.deniedForwardCount == 1);
  }
}